

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

VkImageLayout
vkt::memory::anon_unknown_0::getRandomNextLayout
          (Random *rng,Usage usage,VkImageLayout previousLayout)

{
  VkImageLayout layout;
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  long in_RAX;
  ulong uVar5;
  size_t supportedLayoutCount;
  long lVar6;
  long lVar7;
  undefined8 uStack_38;
  
  lVar7 = 0;
  lVar6 = 0;
  do {
    bVar1 = layoutSupportedByUsage(usage,*(VkImageLayout *)((long)&DAT_00b280f0 + lVar7));
    lVar6 = lVar6 + (ulong)bVar1;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x1c);
  dVar3 = deRandom_getUint32(&rng->m_rnd);
  dVar4 = deRandom_getUint32(&rng->m_rnd);
  lVar7 = 0;
  uVar5 = CONCAT44(dVar3,dVar4) %
          (lVar6 + -1 + (ulong)(previousLayout == VK_IMAGE_LAYOUT_UNDEFINED));
  uStack_38 = in_RAX;
  while( true ) {
    layout = *(VkImageLayout *)((long)&DAT_00b280f0 + lVar7);
    bVar2 = layoutSupportedByUsage(usage,layout);
    bVar1 = true;
    if ((layout != previousLayout) && (bVar2)) {
      if (uVar5 == 0) {
        uVar5 = 0;
        bVar1 = false;
        uStack_38 = (ulong)layout << 0x20;
      }
      else {
        uVar5 = uVar5 - 1;
      }
    }
    if (!bVar1) break;
    lVar7 = lVar7 + 4;
    if (lVar7 == 0x1c) {
      return VK_IMAGE_LAYOUT_UNDEFINED;
    }
  }
  return uStack_38._4_4_;
}

Assistant:

vk::VkImageLayout getRandomNextLayout (de::Random&			rng,
									   Usage				usage,
									   vk::VkImageLayout	previousLayout)
{
	const vk::VkImageLayout	layouts[] =
	{
		vk::VK_IMAGE_LAYOUT_GENERAL,
		vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	};
	const size_t			supportedLayoutCount = getNumberOfSupportedLayouts(usage);

	DE_ASSERT(supportedLayoutCount > 0);

	size_t nextLayoutNdx = ((size_t)rng.getUint64()) % (previousLayout == vk::VK_IMAGE_LAYOUT_UNDEFINED
														? supportedLayoutCount
														: supportedLayoutCount - 1);

	for (size_t layoutNdx = 0; layoutNdx < DE_LENGTH_OF_ARRAY(layouts); layoutNdx++)
	{
		const vk::VkImageLayout layout = layouts[layoutNdx];

		if (layoutSupportedByUsage(usage, layout) && layout != previousLayout)
		{
			if (nextLayoutNdx == 0)
				return layout;
			else
				nextLayoutNdx--;
		}
	}

	DE_FATAL("Unreachable");
	return vk::VK_IMAGE_LAYOUT_UNDEFINED;
}